

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O0

int amqp_time_has_past(amqp_time_t time)

{
  uint64_t uVar1;
  ulong in_RDI;
  uint64_t now_ns;
  undefined4 local_4;
  
  if (in_RDI == 0xffffffffffffffff) {
    local_4 = 0;
  }
  else {
    uVar1 = amqp_get_monotonic_timestamp();
    if (uVar1 == 0) {
      local_4 = -0xe;
    }
    else if (in_RDI < uVar1) {
      local_4 = -0xd;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int amqp_time_has_past(amqp_time_t time) {
  uint64_t now_ns;
  if (UINT64_MAX == time.time_point_ns) {
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns > time.time_point_ns) {
    return AMQP_STATUS_TIMEOUT;
  }
  return AMQP_STATUS_OK;
}